

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minijson_reader.hpp
# Opt level: O1

pair<minijson::value,_char> *
minijson::detail::read_value<minijson::buffer_context>
          (pair<minijson::value,_char> *__return_storage_ptr__,buffer_context *context,
          char first_char)

{
  char cVar1;
  char *pcVar2;
  undefined3 in_register_00000011;
  int iVar3;
  
  iVar3 = CONCAT31(in_register_00000011,first_char);
  if (iVar3 == 0x22) {
    (context->super_buffer_context_base).m_current_write_buffer =
         (context->super_buffer_context_base).m_write_buffer +
         (context->super_buffer_context_base).m_write_offset;
    read_quoted_string<minijson::buffer_context>(context,true);
    pcVar2 = (context->super_buffer_context_base).m_current_write_buffer;
    (__return_storage_ptr__->first).m_type = String;
  }
  else {
    if (iVar3 == 0x5b) {
      (__return_storage_ptr__->first).m_type = Array;
    }
    else {
      if (iVar3 != 0x7b) {
        (context->super_buffer_context_base).m_current_write_buffer =
             (context->super_buffer_context_base).m_write_buffer +
             (context->super_buffer_context_base).m_write_offset;
        cVar1 = read_unquoted_value<minijson::buffer_context>(context,first_char);
        parse_unquoted_value<minijson::buffer_context>(&__return_storage_ptr__->first,context);
        __return_storage_ptr__->second = cVar1;
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->first).m_type = Object;
    }
    pcVar2 = "";
  }
  (__return_storage_ptr__->first).m_buffer = pcVar2;
  (__return_storage_ptr__->first).m_long_value = 0;
  (__return_storage_ptr__->first).m_double_value = 0.0;
  __return_storage_ptr__->second = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::pair<value, char> read_value(Context& context, char first_char)
{
    if (first_char == '{')
    {
        return std::make_pair(value(Object), 0);
    }
    else if (first_char == '[')
    {
        return std::make_pair(value(Array), 0);
    }
    else if (first_char == '"') // quoted string
    {
        context.new_write_buffer();
        read_quoted_string(context, true);

        return std::make_pair(value(String, context.write_buffer()), 0);
    }
    else // unquoted value
    {
        context.new_write_buffer();
        const char ending_char = read_unquoted_value(context, first_char);

        return std::make_pair(parse_unquoted_value(context), ending_char);
    }
}